

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void ImportModuleNamespaces(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx)

{
  SmallArray<NamespaceData_*,_128U> *this;
  uint uVar1;
  ByteCode *code;
  Allocator *allocator;
  ScopeData *scope;
  SmallArray<NamespaceData_*,_2U> *pSVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ExternNamespaceInfo *pEVar6;
  size_t sVar7;
  undefined4 extraout_var;
  NamespaceData **ppNVar9;
  char *pcVar10;
  long lVar11;
  NamespaceData *parent;
  ulong uVar12;
  TraceScope traceScope;
  TraceScope local_90;
  SynIdentifier local_80;
  NamespaceData *pNVar8;
  
  if (ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)::token == '\0') {
    iVar4 = __cxa_guard_acquire(&ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)
                                 ::token);
    if (iVar4 != 0) {
      ImportModuleNamespaces::token = NULLC::TraceGetToken("analyze","ImportModuleNamespaces");
      __cxa_guard_release(&ImportModuleNamespaces(ExpressionContext&,SynBase*,ModuleContext&)::token
                         );
    }
  }
  NULLC::TraceScope::TraceScope(&local_90,ImportModuleNamespaces::token);
  code = moduleCtx->data->bytecode;
  pcVar5 = FindSymbols(code);
  pEVar6 = FindFirstNamespace(code);
  if (code->namespaceCount != 0) {
    this = &ctx->namespaces;
    uVar12 = 0;
    do {
      pcVar10 = pcVar5 + pEVar6[uVar12].offsetToName;
      sVar7 = strlen(pcVar10);
      uVar3 = NULLC::GetStringHash(pcVar10,pcVar10 + sVar7);
      uVar1 = (ctx->namespaces).count;
      if (uVar1 != 0) {
        lVar11 = 0;
        do {
          pNVar8 = this->data[lVar11];
          if (pNVar8->nameHash == uVar3) goto LAB_001741dc;
          lVar11 = lVar11 + 1;
        } while (uVar1 != (uint)lVar11);
      }
      pNVar8 = (NamespaceData *)0x0;
LAB_001741dc:
      if (pEVar6[uVar12].parentHash == 0xffffffff) {
        parent = (NamespaceData *)0x0;
      }
      else {
        if (uVar1 != 0) {
          lVar11 = 0;
          do {
            parent = this->data[lVar11];
            if (parent->nameHash == pEVar6[uVar12].parentHash) goto LAB_00174212;
            lVar11 = lVar11 + 1;
          } while (uVar1 != (uint)lVar11);
        }
        parent = (NamespaceData *)0x0;
LAB_00174212:
        if (parent == (NamespaceData *)0x0) {
          anon_unknown.dwarf_9fd58::Stop
                    (ctx,source,"ERROR: namespace %s parent not found",
                     pcVar5 + pEVar6[uVar12].offsetToName);
        }
      }
      if ((pNVar8 == (NamespaceData *)0x0) || (pNVar8->parent != parent)) {
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xa0);
        pNVar8 = (NamespaceData *)CONCAT44(extraout_var,iVar4);
        allocator = ctx->allocator;
        scope = ctx->scope;
        pcVar10 = pcVar5 + pEVar6[uVar12].offsetToName;
        sVar7 = strlen(pcVar10);
        local_80.name.end = pcVar10 + sVar7;
        local_80.super_SynBase.typeID = 4;
        local_80.super_SynBase.begin = (Lexeme *)0x0;
        local_80.super_SynBase.end = (Lexeme *)0x0;
        local_80.super_SynBase.pos.begin = (char *)0x0;
        local_80.super_SynBase.pos.end._0_2_ = 0;
        local_80.super_SynBase.pos.end._2_6_ = 0;
        local_80.super_SynBase.next._0_2_ = 0;
        local_80.super_SynBase._50_8_ = 0;
        local_80.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
        uVar1 = ctx->uniqueNamespaceId;
        ctx->uniqueNamespaceId = uVar1 + 1;
        local_80.name.begin = pcVar10;
        NamespaceData::NamespaceData(pNVar8,allocator,source,scope,parent,&local_80,uVar1);
        if (parent == (NamespaceData *)0x0) {
          uVar1 = (ctx->globalNamespaces).count;
          if (uVar1 == (ctx->globalNamespaces).max) {
            SmallArray<NamespaceData_*,_2U>::grow(&ctx->globalNamespaces,uVar1);
          }
          ppNVar9 = (ctx->globalNamespaces).data;
          pSVar2 = &ctx->globalNamespaces;
          if (ppNVar9 == (NamespaceData **)0x0) goto LAB_001743e0;
        }
        else {
          uVar1 = (parent->children).count;
          if (uVar1 == (parent->children).max) {
            SmallArray<NamespaceData_*,_2U>::grow(&parent->children,uVar1);
          }
          ppNVar9 = (parent->children).data;
          if (ppNVar9 == (NamespaceData **)0x0) {
LAB_001743e0:
            pcVar5 = 
            "void SmallArray<NamespaceData *, 2>::push_back(const T &) [T = NamespaceData *, N = 2]"
            ;
            goto LAB_001743f5;
          }
          pSVar2 = &parent->children;
        }
        uVar1 = pSVar2->count;
        pSVar2->count = uVar1 + 1;
        ppNVar9[uVar1] = pNVar8;
        uVar1 = (ctx->namespaces).count;
        if (uVar1 == (ctx->namespaces).max) {
          SmallArray<NamespaceData_*,_128U>::grow(this,uVar1);
        }
        if (this->data == (NamespaceData **)0x0) {
          pcVar5 = 
          "void SmallArray<NamespaceData *, 128>::push_back(const T &) [T = NamespaceData *, N = 128]"
          ;
LAB_001743f5:
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,pcVar5);
        }
        uVar1 = (ctx->namespaces).count;
        (ctx->namespaces).count = uVar1 + 1;
        this->data[uVar1] = pNVar8;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < code->namespaceCount);
  }
  NULLC::TraceScope::~TraceScope(&local_90);
  return;
}

Assistant:

void ImportModuleNamespaces(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx)
{
	TRACE_SCOPE("analyze", "ImportModuleNamespaces");

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	// Import namespaces
	ExternNamespaceInfo *namespaceList = FindFirstNamespace(bCode);

	for(unsigned i = 0; i < bCode->namespaceCount; i++)
	{
		ExternNamespaceInfo &namespaceData = namespaceList[i];

		unsigned nameHash = InplaceStr(symbols + namespaceData.offsetToName).hash();

		NamespaceData *prev = NULL;

		for(unsigned k = 0; k < ctx.namespaces.size(); k++)
		{
			if(ctx.namespaces[k]->nameHash == nameHash)
			{
				prev = ctx.namespaces[k];
				break;
			}
		}

		NamespaceData *parent = NULL;

		if(namespaceData.parentHash != ~0u)
		{
			for(unsigned k = 0; k < ctx.namespaces.size(); k++)
			{
				if(ctx.namespaces[k]->nameHash == namespaceData.parentHash)
				{
					parent = ctx.namespaces[k];
					break;
				}
			}

			if(!parent)
				Stop(ctx, source, "ERROR: namespace %s parent not found", symbols + namespaceData.offsetToName);
		}

		if(prev && prev->parent == parent)
			continue;

		NamespaceData *ns = new (ctx.get<NamespaceData>()) NamespaceData(ctx.allocator, source, ctx.scope, parent, SynIdentifier(InplaceStr(symbols + namespaceData.offsetToName)), ctx.uniqueNamespaceId++);

		if(parent)
			parent->children.push_back(ns);
		else
			ctx.globalNamespaces.push_back(ns);

		ctx.namespaces.push_back(ns);
	}
}